

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  uint uVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  lys_node *plVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  LY_ERR *pLVar8;
  ly_set *set;
  lys_module *module;
  bool bVar9;
  bool bVar10;
  LYS_NODE local_94;
  int local_90;
  int stype;
  int i;
  int pos;
  ly_set *llists;
  int local_78;
  int clrdflt;
  int isrpc;
  int invalid;
  lyd_node *next2;
  lyd_node *next1;
  lyd_node *ins;
  lyd_node *iter;
  lyd_node *start;
  lys_node *siter;
  lys_node *par2;
  lys_node *par1;
  lys_node *plStack_28;
  int invalidate_local;
  lyd_node *node_local;
  lyd_node **sibling_local;
  lyd_node *parent_local;
  
  clrdflt = 0;
  local_78 = 0;
  bVar10 = false;
  local_94 = LYS_OUTPUT|LYS_INPUT;
  par1._4_4_ = invalidate;
  plStack_28 = (lys_node *)node;
  node_local = (lyd_node *)sibling;
  sibling_local = (lyd_node **)parent;
  if ((parent == (lyd_node *)0x0) && (sibling == (lyd_node **)0x0)) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xd9a,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    iter = *sibling;
    while (iter->prev->next != (lyd_node *)0x0) {
      iter = iter->prev;
    }
  }
  else {
    iter = parent->child;
  }
  if (iter == (lyd_node *)0x0) {
    if (parent == (lyd_node *)0x0) {
      if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
        lyd_unlink_internal(node,1);
      }
      node_local->schema = plStack_28;
      return 0;
    }
    par2 = parent->schema;
    if ((par2->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
      local_94 = LYS_ACTION|LYS_RPC;
    }
  }
  else if ((parent == (lyd_node *)0x0) ||
          ((parent->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
    par2 = lys_parent(iter->schema);
    while( true ) {
      bVar9 = false;
      if (par2 != (lys_node *)0x0) {
        bVar9 = (par2->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) ==
                LYS_UNKNOWN;
      }
      if (!bVar9) break;
      par2 = lys_parent(par2);
    }
  }
  else {
    par2 = parent->schema;
    local_94 = LYS_ACTION|LYS_RPC;
  }
  siter = lys_parent(((lyd_node *)plStack_28)->schema);
  while( true ) {
    bVar9 = false;
    if (siter != (lys_node *)0x0) {
      bVar9 = (siter->nodetype & (local_94 | (LYS_NOTIF|LYS_LIST|LYS_CONTAINER))) == LYS_UNKNOWN;
    }
    if (!bVar9) break;
    siter = lys_parent(siter);
  }
  if (par2 == siter) {
    if ((par1._4_4_ != 0) &&
       (((local_78 = lyp_is_rpc_action(((lyd_node *)plStack_28)->schema),
         sibling_local == (lyd_node **)0x0 ||
         (((lyd_node *)plStack_28)->parent != (lyd_node *)sibling_local)) ||
        (clrdflt = local_78, local_78 != 0)))) {
      clrdflt = local_78 + 1;
    }
    if ((((lyd_node *)plStack_28)->parent != (lyd_node *)0x0) ||
       (((lyd_node *)plStack_28)->prev->next != (lyd_node *)0x0)) {
      lyd_unlink_internal((lyd_node *)plStack_28,clrdflt);
    }
    set = ly_set_new();
    next1 = (lyd_node *)plStack_28;
    plVar2 = next1;
    while (next1 = plVar2, next1 != (lyd_node *)0x0) {
      plVar2 = next1->next;
      if ((clrdflt == 1) &&
         (iVar6 = lyv_multicases(next1,(lys_node *)0x0,&iter,1,(lyd_node *)0x0), iVar6 != 0)) {
        ly_set_free(set);
        return 1;
      }
      next1->prev = next1;
      next1->next = (lyd_node *)0x0;
      ins = (lyd_node *)0x0;
      if ((next1->field_0x9 & 1) == 0) {
        bVar10 = true;
      }
      if (((((next1->field_0x9 & 1) == 0) && (sibling_local != (lyd_node **)0x0)) &&
          (*(int *)&(*sibling_local)[1].schema == 0x10)) &&
         ((next1->schema->nodetype == LYS_LEAF &&
          (iVar6 = lys_is_key((lys_node_list *)*sibling_local,(lys_node_leaf *)next1->schema),
          iVar6 != 0)))) {
        local_90 = 0;
        ins = sibling_local[6];
        while( true ) {
          bVar9 = false;
          if ((ins != (lyd_node *)0x0) && (bVar9 = false, local_90 < iVar6 + -1)) {
            bVar9 = ins->schema->nodetype == LYS_LEAF;
          }
          if (!bVar9) break;
          local_90 = local_90 + 1;
          ins = ins->next;
        }
        if (ins != (lyd_node *)0x0) {
          if (sibling_local[6] == ins) {
            sibling_local[6] = next1;
          }
          if (ins->prev->next != (lyd_node *)0x0) {
            ins->prev->next = next1;
          }
          next1->prev = ins->prev;
          ins->prev = next1;
          next1->next = ins;
          if (sibling_local[6] != iter) {
            iter = sibling_local[6];
          }
        }
      }
      else if (next1->schema->nodetype == LYS_LEAFLIST) {
        uVar1 = set->number;
        uVar7 = ly_set_add(set,next1->schema,0);
        if ((uVar7 != uVar1) || ((next1->field_0x9 & 1) != 0)) {
          ins = iter;
          plVar3 = ins;
          while (ins = plVar3, ins != (lyd_node *)0x0) {
            plVar3 = ins->next;
            if ((ins->schema == next1->schema) &&
               ((((next1->field_0x9 & 1) != 0 &&
                 (((ins->field_0x9 & 1) == 0 ||
                  (((ins->schema->flags & 1) != 0 &&
                   (iVar6 = strcmp((char *)ins->child,(char *)next1->child), iVar6 == 0)))))) ||
                (((next1->field_0x9 & 1) == 0 && ((ins->field_0x9 & 1) != 0)))))) {
              if (ins == iter) {
                iter = plVar3;
              }
              lyd_free(ins);
            }
          }
        }
      }
      else if ((next1->schema->nodetype == LYS_LEAF) ||
              ((next1->schema->nodetype == LYS_CONTAINER &&
               (plVar4 = next1->schema, lVar5._0_2_ = plVar4[1].flags,
               lVar5._2_1_ = plVar4[1].ext_size, lVar5._3_1_ = plVar4[1].iffeature_size,
               lVar5._4_1_ = plVar4[1].padding[0], lVar5._5_1_ = plVar4[1].padding[1],
               lVar5._6_1_ = plVar4[1].padding[2], lVar5._7_1_ = plVar4[1].padding[3], lVar5 == 0)))
              ) {
        for (ins = iter; ins != (lyd_node *)0x0; ins = ins->next) {
          if (ins->schema == next1->schema) {
            if (((next1->field_0x9 & 1) == 0) && ((ins->field_0x9 & 1) == 0)) {
              ins = (lyd_node *)0x0;
            }
            else {
              lyd_replace(ins,next1,1);
            }
            break;
          }
        }
      }
      if (ins == (lyd_node *)0x0) {
        if (iter == (lyd_node *)0x0) {
          iter = next1;
          if (sibling_local != (lyd_node **)0x0) {
            sibling_local[6] = next1;
          }
        }
        else if (local_78 == 0) {
          iter->prev->next = next1;
          next1->prev = iter->prev;
          iter->prev = next1;
        }
        else {
          for (par2 = next1->schema->parent;
              (par2->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN; par2 = lys_parent(par2)) {
          }
          start = (lyd_node *)0x0;
          ins = iter;
LAB_0018cdd6:
          if (ins == (lyd_node *)0x0) goto LAB_0018cf2d;
          do {
            plVar4 = par2;
            plVar3 = start;
            module = lys_node_module(par2);
            start = (lyd_node *)lys_getnext((lys_node *)plVar3,plVar4,module,0);
            if (((lys_node *)start == (lys_node *)0x0) || (ins->schema == (lys_node *)start)) break;
          } while (next1->schema != (lys_node *)start);
          if (next1->schema != (lys_node *)start) {
            ins = ins->next;
            goto LAB_0018cdd6;
          }
          if (((((lys_node *)start)->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (ins->schema != (lys_node *)start)) goto LAB_0018ceb9;
          while( true ) {
            bVar9 = false;
            if (ins != (lyd_node *)0x0) {
              bVar9 = ins->schema == (lys_node *)start;
            }
            if (!bVar9) break;
            ins = ins->next;
          }
          if (ins != (lyd_node *)0x0) {
LAB_0018ceb9:
            if (ins == iter) {
              iter = next1;
              if (sibling_local != (lyd_node **)0x0) {
                sibling_local[6] = next1;
              }
            }
            else {
              ins->prev->next = next1;
            }
            next1->prev = ins->prev;
            ins->prev = next1;
            next1->next = ins;
          }
LAB_0018cf2d:
          if (ins == (lyd_node *)0x0) {
            iter->prev->next = next1;
            next1->prev = iter->prev;
            iter->prev = next1;
          }
        }
      }
      next1->parent = (lyd_node *)sibling_local;
      if (par1._4_4_ != 0) {
        check_leaf_list_backlinks(next1,0);
      }
      if (clrdflt != 0) {
        lyd_insert_setinvalid(next1);
      }
    }
    ly_set_free(set);
    if (bVar10) {
      ins = (lyd_node *)sibling_local;
      while( true ) {
        bVar10 = false;
        if (ins != (lyd_node *)0x0) {
          bVar10 = (ins->field_0x9 & 1) != 0;
        }
        if (!bVar10) break;
        ins->field_0x9 = ins->field_0x9 & 0xfe;
        ins = ins->parent;
      }
    }
    if (node_local != (lyd_node *)0x0) {
      node_local->schema = (lys_node *)iter;
    }
    parent_local._4_4_ = 0;
  }
  else {
    pLVar8 = ly_errno_location();
    *pLVar8 = LY_EINVAL;
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int pos, i;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && parent && parent->schema->nodetype == LYS_LIST && ins->schema->nodetype == LYS_LEAF
                && (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)ins->schema))) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < (pos - 1) && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next) ;
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }
        ins->parent = parent;

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}